

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_loader.cpp
# Opt level: O0

loader * __thiscall loader::to_string_abi_cxx11_(loader *this,ze_init_flags_t flags)

{
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  ze_init_flags_t local_14;
  loader *plStack_10;
  ze_init_flags_t flags_local;
  
  local_14 = flags;
  plStack_10 = this;
  if ((flags & 1) == 0) {
    if ((flags & 2) == 0) {
      if (flags == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)this,"0(ZE_INIT_ALL_DRIVER_TYPES_ENABLED)",&local_26)
        ;
        std::allocator<char>::~allocator((allocator<char> *)&local_26);
      }
      else {
        std::__cxx11::to_string((__cxx11 *)this,flags);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,"ZE_INIT_FLAG_VPU_ONLY",local_25);
      std::allocator<char>::~allocator((allocator<char> *)local_25);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"ZE_INIT_FLAG_GPU_ONLY",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  return this;
}

Assistant:

std::string to_string(const ze_init_flags_t flags) {
        if (flags & ZE_INIT_FLAG_GPU_ONLY) {
            return "ZE_INIT_FLAG_GPU_ONLY";
        } else if (flags & ZE_INIT_FLAG_VPU_ONLY) {
            return "ZE_INIT_FLAG_VPU_ONLY";
        } else if (flags == 0) {
            return "0(ZE_INIT_ALL_DRIVER_TYPES_ENABLED)";
        } else {
            return (std::to_string(static_cast<int>(flags)));
        }
    }